

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O2

void strbuffer_init(strbuffer_t *buffer,int capacity,int increment)

{
  int iVar1;
  char *pcVar2;
  size_t __size;
  
  __size = 0x50;
  if (0x50 < capacity) {
    __size = (size_t)(uint)capacity;
  }
  buffer->capacity = (int)__size;
  iVar1 = 10;
  if (10 < increment) {
    iVar1 = increment;
  }
  buffer->increment = iVar1;
  pcVar2 = (char *)malloc(__size);
  buffer->data = pcVar2;
  buffer->pos = 0;
  return;
}

Assistant:

void strbuffer_init(strbuffer_t* buffer, int capacity, int increment)
{
    if (capacity < MIN_CAPACITY)
        buffer->capacity = MIN_CAPACITY;
    else buffer->capacity = capacity;

    if (increment < MIN_INCREMENT)
        buffer->increment = MIN_INCREMENT;
    else buffer->increment = increment;

    buffer->data = (char*) malloc(buffer->capacity * sizeof(char));
    buffer->pos = 0;
}